

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lrzip.c
# Opt level: O1

int lrzip_bidder_init(archive_read_filter *self)

{
  int iVar1;
  
  iVar1 = __archive_read_program(self,"lrzip -d -q");
  self->code = 10;
  self->name = "lrzip";
  return iVar1;
}

Assistant:

static int
lrzip_bidder_init(struct archive_read_filter *self)
{
	int r;

	r = __archive_read_program(self, "lrzip -d -q");
	/* Note: We set the format here even if __archive_read_program()
	 * above fails.  We do, after all, know what the format is
	 * even if we weren't able to read it. */
	self->code = ARCHIVE_FILTER_LRZIP;
	self->name = "lrzip";
	return (r);
}